

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catridge.cpp
# Opt level: O3

void __thiscall Catridge::Catridge(Catridge *this,string *sFileName)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  char cVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  Mapper *__tmp;
  size_type __new_size;
  sHeader header;
  ifstream ifs;
  undefined1 auStack_238 [4];
  byte local_234;
  byte local_233;
  byte local_232;
  byte local_231;
  char local_228 [520];
  
  this->mirror = HORIZONTAL;
  this->bImageValid = false;
  (this->vPRGMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vPRGMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vPRGMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->vCHRMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vCHRMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vCHRMemory).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pMapper).super___shared_ptr<Mapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->pMapper).super___shared_ptr<Mapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined4 *)
   ((long)&(this->pMapper).super___shared_ptr<Mapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
   + 7) = 0;
  std::ifstream::ifstream(local_228,(string *)sFileName,_S_bin);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    std::istream::read(local_228,(long)auStack_238);
    if ((local_232 & 4) != 0) {
      std::istream::seekg((long)local_228,0x200);
    }
    this->nMapperID = local_232 >> 4 | local_231 & 0xf0;
    this->mirror = (uint)(local_232 & 1);
    this->nPRGBanks = local_234;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&this->vPRGMemory,(ulong)local_234 << 0xe);
    std::istream::read(local_228,
                       (long)(this->vPRGMemory).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    this->nCHRBanks = local_233;
    __new_size = 0x2000;
    if (local_233 != 0) {
      __new_size = (ulong)local_233 << 0xd;
    }
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->vCHRMemory,__new_size)
    ;
    std::istream::read(local_228,
                       (long)(this->vCHRMemory).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start);
    if (this->nMapperID == '\0') {
      p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x20);
      p_Var2->_M_use_count = 1;
      p_Var2->_M_weak_count = 1;
      p_Var2->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00130cc0;
      *(undefined2 *)&p_Var2[1]._M_use_count = *(undefined2 *)&this->nPRGBanks;
      p_Var2[1]._vptr__Sp_counted_base = (_func_int **)&PTR_cpuMapRead_00130d10;
      (this->pMapper).super___shared_ptr<Mapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)(p_Var2 + 1);
      this_00 = (this->pMapper).super___shared_ptr<Mapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
      (this->pMapper).super___shared_ptr<Mapper,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           p_Var2;
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
      }
    }
    this->bImageValid = true;
  }
  std::ifstream::~ifstream(local_228);
  return;
}

Assistant:

Catridge::Catridge(const string &sFileName)
{
  struct sHeader
  {
    char name[4];
    uint8_t prg_rom_chunks;
    uint8_t chr_rom_chunks;
    uint8_t mapper1;
    uint8_t mapper2;
    uint8_t prg_ram_size;
    uint8_t tv_system1;
    uint8_t tv_system2;
    char unused[5];
  } header;

  std::ifstream ifs(sFileName, ifstream::binary);
  if (ifs.is_open())
  {
    ifs.read((char *)&header, sizeof(sHeader));

    if (header.mapper1 & 0x04u)
    {
      ifs.seekg(512, ios_base::cur);
    }

    nMapperID = ((header.mapper2 >> 4) << 4) | (header.mapper1 >> 4);
    mirror = (header.mapper1 & 0x01u) ? VERTICAL : HORIZONTAL;

    // "Discover" File format
    uint8_t nFileType = 1;

    if (nFileType == 0)
    {
    }

    if (nFileType == 1)
    {
      nPRGBanks = header.prg_rom_chunks;
      vPRGMemory.resize(nPRGBanks * 16384); // nPRGBanks * 16 KB
      ifs.read((char *)vPRGMemory.data(), vPRGMemory.size());

      nCHRBanks = header.chr_rom_chunks;
      if (nCHRBanks == 0)
      {
        vCHRMemory.resize(8192); // 8 KB
      }
      else
      {
        vCHRMemory.resize(nCHRBanks * 8192); // nPRGBanks * 8 KB
      }
      ifs.read((char *)vCHRMemory.data(), vCHRMemory.size());
    }

    if (nFileType == 2)
    {
    }

    switch (nMapperID)
    {
    case 0:
      pMapper = make_shared<Mapper_000>(nPRGBanks, nCHRBanks);
      break;
    default:
      break;
    }

    bImageValid = true;
  }
}